

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalRecursiveCTE::GetData
          (PhysicalRecursiveCTE *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  pointer this_00;
  __pthread_internal_list **this_01;
  ColumnDataScanState *state;
  bool bVar1;
  pointer pGVar2;
  pointer pGVar3;
  ColumnDataCollection *pCVar4;
  Allocator *pAVar5;
  ExecutionContext *context_00;
  DataChunk result;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2c8;
  DataChunk distinct_rows;
  DataChunk payload_rows;
  AggregateHTScanState scan_state;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  if (pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] == '\0') {
    if (this->using_key == false) {
      pCVar4 = (ColumnDataCollection *)
               &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list.__next;
    }
    else {
      pGVar3 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
               ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                             *)(pGVar2 + 1));
      GroupedAggregateHashTable::InitializeScan
                (pGVar3,(AggregateHTScanState *)
                        &pGVar2[4].super_StateWithBlockableTasks.blocked_tasks);
      pCVar4 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->recurring_table);
    }
    ColumnDataCollection::InitializeScan
              (pCVar4,(ColumnDataScanState *)
                      &pGVar2[2].super_StateWithBlockableTasks.blocked_tasks.
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       .
                       super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,ALLOW_ZERO_COPY);
    *(undefined2 *)
     ((long)&pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8) = 1;
  }
  this_01 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
  state = (ColumnDataScanState *)
          &pGVar2[2].super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00 = pGVar2 + 1;
LAB_009f0800:
  do {
    if (chunk->count != 0) {
LAB_009f0b5f:
      return chunk->count == 0;
    }
    if (pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] != '\0')
    {
      if (((this->using_key != false) && (this->ref_recurring == true)) &&
         (pGVar2[2]._vptr_GlobalSinkState != (_func_int **)0x0)) {
        pCVar4 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->recurring_table);
        ColumnDataCollection::Reset(pCVar4);
        AggregateHTScanState::AggregateHTScanState(&scan_state);
        pGVar3 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                 ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                               *)this_00);
        GroupedAggregateHashTable::InitializeScan(pGVar3,&scan_state);
        DataChunk::DataChunk(&result);
        DataChunk::DataChunk(&payload_rows);
        DataChunk::DataChunk(&distinct_rows);
        pAVar5 = Allocator::DefaultAllocator();
        DataChunk::Initialize(&distinct_rows,pAVar5,&this->distinct_types,0x800);
        if ((this->payload_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->payload_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar5 = Allocator::DefaultAllocator();
          DataChunk::Initialize(&payload_rows,pAVar5,&this->payload_types,0x800);
        }
        pAVar5 = Allocator::DefaultAllocator();
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_2c8,chunk);
        DataChunk::Initialize(&result,pAVar5,(vector<duckdb::LogicalType,_true> *)&local_2c8,0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_2c8);
        while( true ) {
          pGVar3 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                   ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                                 *)this_00);
          bVar1 = GroupedAggregateHashTable::Scan(pGVar3,&scan_state,&distinct_rows,&payload_rows);
          if (!bVar1) break;
          PopulateChunk(&result,&distinct_rows,&this->distinct_idx,false);
          PopulateChunk(&result,&payload_rows,&this->payload_idx,false);
          pCVar4 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->
                             (&this->recurring_table);
          ColumnDataCollection::Append(pCVar4,&result);
        }
        DataChunk::~DataChunk(&distinct_rows);
        DataChunk::~DataChunk(&payload_rows);
        DataChunk::~DataChunk(&result);
        TupleDataScanState::~TupleDataScanState(&scan_state.scan_states);
      }
      pCVar4 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->working_table);
      ColumnDataCollection::Reset(pCVar4);
      pCVar4 = shared_ptr<duckdb::ColumnDataCollection,_true>::operator->(&this->working_table);
      context_00 = (ExecutionContext *)this_01;
      ColumnDataCollection::Combine(pCVar4,(ColumnDataCollection *)this_01);
      pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] = '\0';
      ColumnDataCollection::Reset((ColumnDataCollection *)this_01);
      ExecuteRecursivePipelines(this,context_00);
      if (pGVar2[2]._vptr_GlobalSinkState == (_func_int **)0x0) {
        pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] = '\x01';
        if (this->using_key == true) {
          DataChunk::DataChunk((DataChunk *)&scan_state);
          DataChunk::DataChunk(&result);
          pAVar5 = Allocator::DefaultAllocator();
          DataChunk::Initialize(&result,pAVar5,&this->distinct_types,0x800);
          if ((this->payload_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (this->payload_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar5 = Allocator::DefaultAllocator();
            DataChunk::Initialize((DataChunk *)&scan_state,pAVar5,&this->payload_types,0x800);
          }
          pGVar3 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                   ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                                 *)this_00);
          GroupedAggregateHashTable::Scan
                    (pGVar3,(AggregateHTScanState *)
                            &pGVar2[4].super_StateWithBlockableTasks.blocked_tasks,&result,
                     (DataChunk *)&scan_state);
          PopulateChunk(chunk,&result,&this->distinct_idx,false);
          PopulateChunk(chunk,(DataChunk *)&scan_state,&this->payload_idx,false);
          DataChunk::~DataChunk(&result);
          DataChunk::~DataChunk((DataChunk *)&scan_state);
        }
        goto LAB_009f0b5f;
      }
      if (this->using_key == false) {
        ColumnDataCollection::InitializeScan((ColumnDataCollection *)this_01,state,ALLOW_ZERO_COPY);
      }
      goto LAB_009f0800;
    }
    if (this->using_key == false) {
      ColumnDataCollection::Scan((ColumnDataCollection *)this_01,state,chunk);
      if (chunk->count != 0) goto LAB_009f0b5f;
    }
    pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] = '\x01';
  } while( true );
}

Assistant:

SourceResultType PhysicalRecursiveCTE::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<RecursiveCTEState>();
	if (!gstate.initialized) {
		if (!using_key) {
			gstate.intermediate_table.InitializeScan(gstate.scan_state);
		} else {
			gstate.ht->InitializeScan(gstate.ht_scan_state);
			recurring_table->InitializeScan(gstate.scan_state);
		}
		gstate.finished_scan = false;
		gstate.initialized = true;
	}
	while (chunk.size() == 0) {
		if (!gstate.finished_scan) {
			if (!using_key) {
				// scan any chunks we have collected so far
				gstate.intermediate_table.Scan(gstate.scan_state, chunk);
			}
			if (chunk.size() == 0) {
				gstate.finished_scan = true;
			} else {
				break;
			}
		} else {
			// we have run out of chunks
			// now we need to recurse
			// we set up the working table as the data we gathered in this iteration of the recursion

			// After an iteration, we reset the recurring table
			// and fill it up with the new hash table rows for the next iteration.
			if (using_key && ref_recurring && gstate.intermediate_table.Count() != 0) {
				recurring_table->Reset();
				AggregateHTScanState scan_state;
				gstate.ht->InitializeScan(scan_state);

				// Initialise the DataChunks to read the resulting rows.
				// One DataChunk for the payload, one for the keys.
				// Create a new DataChunk to store the result.
				DataChunk result;
				DataChunk payload_rows;
				DataChunk distinct_rows;
				distinct_rows.Initialize(Allocator::DefaultAllocator(), distinct_types);
				if (!payload_types.empty()) {
					payload_rows.Initialize(Allocator::DefaultAllocator(), payload_types);
				}
				result.Initialize(Allocator::DefaultAllocator(), chunk.GetTypes());

				while (gstate.ht->Scan(scan_state, distinct_rows, payload_rows)) {
					// Populate the result DataChunk with the keys and the payload.
					PopulateChunk(result, distinct_rows, distinct_idx, false);
					PopulateChunk(result, payload_rows, payload_idx, false);
					// Append the result to the recurring table.
					recurring_table->Append(result);
				}
			}

			working_table->Reset();
			working_table->Combine(gstate.intermediate_table);
			// and we clear the intermediate table
			gstate.finished_scan = false;
			gstate.intermediate_table.Reset();
			// now we need to re-execute all of the pipelines that depend on the recursion
			ExecuteRecursivePipelines(context);

			// check if we obtained any results
			// if not, we are done
			if (gstate.intermediate_table.Count() == 0) {
				gstate.finished_scan = true;
				if (using_key) {
					// Initialise the DataChunks to read the ht.
					// One DataChunk for payload, one for keys.
					DataChunk payload_rows;
					DataChunk distinct_rows;
					distinct_rows.Initialize(Allocator::DefaultAllocator(), distinct_types);
					if (!payload_types.empty()) {
						payload_rows.Initialize(Allocator::DefaultAllocator(), payload_types);
					}

					gstate.ht->Scan(gstate.ht_scan_state, distinct_rows, payload_rows);
					PopulateChunk(chunk, distinct_rows, distinct_idx, false);
					PopulateChunk(chunk, payload_rows, payload_idx, false);
				}
				break;
			}
			if (!using_key) {
				// set up the scan again
				gstate.intermediate_table.InitializeScan(gstate.scan_state);
			}
		}
	}

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}